

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O2

int __thiscall bdQuery::trimProxies(bdQuery *this)

{
  while (10 < (this->mProxiesUnknown).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl.
              _M_node._M_size) {
    std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::pop_back(&this->mProxiesUnknown);
  }
  while (10 < (this->mProxiesFlagged).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl.
              _M_node._M_size) {
    std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::pop_back(&this->mProxiesFlagged);
  }
  return 1;
}

Assistant:

int bdQuery::trimProxies() {

	/* drop excess Potential Proxies */
	while(mProxiesUnknown.size() > MAX_POTENTIAL_PROXIES)
		mProxiesUnknown.pop_back();

	while(mProxiesFlagged.size() > MAX_POTENTIAL_PROXIES)
		mProxiesFlagged.pop_back();
	return 1;
}